

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O2

char * sha256_Data(sha2_byte *data,size_t len,char *digest)

{
  char *pcVar1;
  SHA256_CTX context;
  SHA256_CTX SStack_88;
  
  sha256_Init(&SStack_88);
  sha256_Update(&SStack_88,data,len);
  pcVar1 = sha256_End(&SStack_88,digest);
  return pcVar1;
}

Assistant:

char* sha256_Data(const sha2_byte* data, size_t len, char digest[SHA256_DIGEST_STRING_LENGTH]) {
    trezor::SHA256_CTX	context;

	sha256_Init(&context);
	sha256_Update(&context, data, len);
	return sha256_End(&context, digest);
}